

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_slice.c
# Opt level: O2

ALLEGRO_FILE * al_fopen_slice(ALLEGRO_FILE *fp,size_t initial_size,char *mode)

{
  undefined8 *userdata;
  char *pcVar1;
  int64_t iVar2;
  ALLEGRO_FILE *pAVar3;
  
  userdata = (undefined8 *)
             al_calloc_with_context
                       (1,0x28,0xcf,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file_slice.c"
                        ,"al_fopen_slice");
  if (userdata == (undefined8 *)0x0) {
    return (ALLEGRO_FILE *)0x0;
  }
  pcVar1 = strchr(mode,0x72);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strchr(mode,0x52);
    if (pcVar1 != (char *)0x0) goto LAB_0015959b;
  }
  else {
LAB_0015959b:
    *(byte *)(userdata + 4) = *(byte *)(userdata + 4) | 1;
  }
  pcVar1 = strchr(mode,0x77);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strchr(mode,0x57);
    if (pcVar1 != (char *)0x0) goto LAB_001595c0;
  }
  else {
LAB_001595c0:
    *(byte *)(userdata + 4) = *(byte *)(userdata + 4) | 2;
  }
  pcVar1 = strchr(mode,0x65);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strchr(mode,0x45);
    if (pcVar1 == (char *)0x0) goto LAB_001595ea;
  }
  *(byte *)(userdata + 4) = *(byte *)(userdata + 4) | 4;
LAB_001595ea:
  *userdata = fp;
  iVar2 = al_ftell(fp);
  userdata[1] = iVar2;
  userdata[3] = initial_size;
  pAVar3 = al_create_file_handle(&fi,userdata);
  return pAVar3;
}

Assistant:

ALLEGRO_FILE *al_fopen_slice(ALLEGRO_FILE *fp, size_t initial_size, const char *mode)
{
   SLICE_DATA *userdata = al_calloc(1, sizeof(*userdata));
   
   if (!userdata) {
      return NULL;
   }
   
   if (strstr(mode, "r") || strstr(mode, "R")) {
      userdata->mode |= SLICE_READ;
   }
   
   if (strstr(mode, "w") || strstr(mode, "W")) {
      userdata->mode |= SLICE_WRITE;
   }
   
   if (strstr(mode, "e") || strstr(mode, "E")) {
      userdata->mode |= SLICE_EXPANDABLE;
   }
   
   userdata->fp = fp;
   userdata->anchor = al_ftell(fp);
   userdata->size = initial_size;
   
   return al_create_file_handle(&fi, userdata);
}